

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  const_iterator local_40;
  int local_38;
  int local_34;
  int p;
  int length;
  char *data;
  double timeout_local;
  string *line_local;
  cmProcess *this_local;
  
  data = (char *)timeout;
  timeout_local = (double)line;
  line_local = (string *)this;
  while( true ) {
    bVar1 = Buffer::GetLine(&this->Output,(string *)timeout_local);
    if (bVar1) {
      return 2;
    }
    local_38 = cmsysProcess_WaitForData(this->Process,(char **)&p,&local_34,(double *)&data);
    if (local_38 == 0xff) {
      return 0xff;
    }
    if (local_38 != 2) break;
    local_48._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           (&(this->Output).super_vector<char,_std::allocator<char>_>);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_40,
               &local_48);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)&this->Output,local_40,_p,_p + local_34);
  }
  bVar1 = Buffer::GetLast(&this->Output,(string *)timeout_local);
  if (bVar1) {
    return 2;
  }
  iVar2 = cmsysProcess_WaitForExit(this->Process,(double *)&data);
  if (iVar2 == 0) {
    return 0xff;
  }
  iVar2 = cmsysProcess_GetExitValue(this->Process);
  this->ExitValue = iVar2;
  dVar3 = cmsys::SystemTools::GetTime();
  this->TotalTime = dVar3 - this->StartTime;
  if (this->TotalTime <= 0.0) {
    this->TotalTime = 0.0;
  }
  return 0;
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  for(;;)
    {
    // Look for lines already buffered.
    if(this->Output.GetLine(line))
      {
      return cmsysProcess_Pipe_STDOUT;
      }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if(p == cmsysProcess_Pipe_Timeout)
      {
      return cmsysProcess_Pipe_Timeout;
      }
    else if(p == cmsysProcess_Pipe_STDOUT)
      {
      this->Output.insert(this->Output.end(), data, data+length);
      }
    else // p == cmsysProcess_Pipe_None
      {
      // The process will provide no more data.
      break;
      }
    }

  // Look for partial last lines.
  if(this->Output.GetLast(line))
    {
    return cmsysProcess_Pipe_STDOUT;
    }

  // No more data.  Wait for process exit.
  if(!cmsysProcess_WaitForExit(this->Process, &timeout))
    {
    return cmsysProcess_Pipe_Timeout;
    }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0)
    {
    this->TotalTime = 0.0;
    }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}